

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TgReorderFGrps(Abc_TgMan_t *pMan)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  if ((pMan->fPhased == 0) && (uVar2 = (ulong)pMan->pGroup[0].nGVars, 0 < (long)uVar2)) {
    uVar3 = 0;
    do {
      cVar1 = pMan->pPerm[uVar3];
      if (uVar3 == 0) {
        lVar6 = 0;
      }
      else {
        uVar5 = uVar3 & 0xffffffff;
        do {
          iVar4 = (int)uVar5;
          if (pMan->symPhase[pMan->pFGrps[uVar5 - 1]] <= pMan->symPhase[cVar1]) goto LAB_0050b33b;
          pMan->pFGrps[uVar5] = pMan->pFGrps[uVar5 - 1];
          uVar5 = (ulong)(iVar4 - 1);
        } while (1 < iVar4);
        iVar4 = 0;
LAB_0050b33b:
        lVar6 = (long)iVar4;
      }
      pMan->pFGrps[lVar6] = cVar1;
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

static void Abc_TgReorderFGrps(Abc_TgMan_t * pMan)
{
    char * pFGrps = pMan->pFGrps;
    int i, j, n = pMan->fPhased ? 0 : pMan->pGroup->nGVars;

    // sort by symPhase
    for (i = 0; i < n; i++)
    {
        char iv = pMan->pPerm[i];
        for (j = i; j > 0 && pMan->symPhase[(int)pFGrps[j - 1]] > pMan->symPhase[(int)iv]; j--)
            pFGrps[j] = pFGrps[j - 1];
        pFGrps[j] = iv;
    }
}